

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

SobolSampler *
pbrt::SobolSampler::Create
          (ParameterDictionary *parameters,Point2i *fullResolution,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  SobolSampler *pSVar4;
  RandomizeStrategy randomizer;
  int nsamp;
  allocator<char> local_92;
  allocator<char> local_91;
  string s;
  Allocator alloc_local;
  string local_68;
  string local_48;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"pixelsamples",(allocator<char> *)&local_68);
  iVar2 = ParameterDictionary::GetOneInt(parameters,&s,0x10);
  std::__cxx11::string::~string((string *)&s);
  nsamp = iVar2;
  if (*(char *)(Options + 0x20) == '\x01') {
    piVar3 = pstd::optional<int>::value((optional<int> *)(Options + 0x1c));
    nsamp = *piVar3;
  }
  if (*(char *)(Options + 0x2c) == '\x01') {
    nsamp = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"randomization",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"fastowen",&local_92);
  ParameterDictionary::GetOneString(&s,parameters,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = std::operator==(&s,"none");
  if (bVar1) {
    randomizer = None;
  }
  else {
    bVar1 = std::operator==(&s,"cranleypatterson");
    if (bVar1) {
      randomizer = CranleyPatterson;
    }
    else {
      bVar1 = std::operator==(&s,"permutedigits");
      if (bVar1) {
        randomizer = PermuteDigits;
      }
      else {
        bVar1 = std::operator==(&s,"fastowen");
        if (bVar1) {
          randomizer = FastOwen;
        }
        else {
          bVar1 = std::operator==(&s,"owen");
          if (!bVar1) {
            ErrorExit<std::__cxx11::string&>
                      (loc,"%s: unknown randomization strategy given to SobolSampler",&s);
          }
          randomizer = Owen;
        }
      }
    }
  }
  pSVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SobolSampler,int&,pbrt::Point2<int>const&,pbrt::RandomizeStrategy&>
                     (&alloc_local,&nsamp,fullResolution,&randomizer);
  std::__cxx11::string::~string((string *)&s);
  return pSVar4;
}

Assistant:

SobolSampler *SobolSampler::Create(const ParameterDictionary &parameters,
                                   const Point2i &fullResolution, const FileLoc *loc,
                                   Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "fastowen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        randomizer = RandomizeStrategy::FastOwen;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to SobolSampler", s);

    return alloc.new_object<SobolSampler>(nsamp, fullResolution, randomizer);
}